

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::mouse_released(Application *this,e_mouse_button b)

{
  e_mouse_button b_local;
  Application *this_local;
  
  if (b == LEFT) {
    this->leftDown = false;
  }
  else if (b == RIGHT) {
    this->rightDown = false;
  }
  else if (b == MIDDLE) {
    this->middleDown = false;
  }
  return;
}

Assistant:

void Application::mouse_released(e_mouse_button b) {
    switch (b) {
      case LEFT:
        leftDown = false;
        break;
      case RIGHT:
        rightDown = false;
        break;
      case MIDDLE:
        middleDown = false;
        break;
    }
}